

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O1

void __thiscall hgdb::json::Module::add_instance(Module *this,string *name,Module *m)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_hgdb::json::Module_*>
  local_50;
  
  paVar1 = &local_50.first.field_2;
  pcVar2 = (name->_M_dataplus)._M_p;
  local_50.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + name->_M_string_length);
  local_50.second = m;
  std::
  vector<std::pair<std::__cxx11::string,hgdb::json::Module_const*>,std::allocator<std::pair<std::__cxx11::string,hgdb::json::Module_const*>>>
  ::emplace_back<std::pair<std::__cxx11::string,hgdb::json::Module_const*>>
            ((vector<std::pair<std::__cxx11::string,hgdb::json::Module_const*>,std::allocator<std::pair<std::__cxx11::string,hgdb::json::Module_const*>>>
              *)&this->instances_,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_50.first._M_dataplus._M_p,local_50.first.field_2._M_allocated_capacity + 1
                   );
  }
  if ((this->remove_inst_).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->remove_inst_)._M_invoker)((_Any_data *)&this->remove_inst_,&m->name_);
    return;
  }
  uVar3 = std::__throw_bad_function_call();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_50.first._M_dataplus._M_p,local_50.first.field_2._M_allocated_capacity + 1
                   );
  }
  _Unwind_Resume(uVar3);
}

Assistant:

void add_instance(const std::string &name, const Module *m) {
        instances_.emplace_back(std::make_pair(name, m));
        remove_inst_(m->name_);
    }